

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O2

void __thiscall tf::TFProfObserver::Summary::dump_wsum(Summary *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  pointer pWVar6;
  size_t max_w;
  size_t min_w;
  size_t l_w;
  size_t d_w;
  size_t avg_w;
  size_t c_w;
  pointer local_58;
  string local_50;
  
  l_w = 5;
  c_w = 5;
  d_w = 9;
  avg_w = 8;
  min_w = 8;
  max_w = 8;
  std::
  for_each<__gnu_cxx::__normal_iterator<tf::TFProfObserver::WorkerSummary_const*,std::vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>>,tf::TFProfObserver::Summary::dump_wsum(std::ostream&)const::_lambda(auto:1_const&)_1_>
            ((this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_ba1d5cc4)&l_w);
  std::
  for_each<__gnu_cxx::__normal_iterator<tf::TFProfObserver::WorkerSummary_const*,std::vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>>,tf::TFProfObserver::Summary::dump_wsum(std::ostream&)const::_lambda(auto:1_const&)_2_>
            ((this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_ba1d3afb)&c_w);
  std::
  for_each<__gnu_cxx::__normal_iterator<tf::TFProfObserver::WorkerSummary_const*,std::vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>>,tf::TFProfObserver::Summary::dump_wsum(std::ostream&)const::_lambda(auto:1_const&)_3_>
            ((this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_ba1d3ebc)&d_w);
  std::
  for_each<__gnu_cxx::__normal_iterator<tf::TFProfObserver::WorkerSummary_const*,std::vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>>,tf::TFProfObserver::Summary::dump_wsum(std::ostream&)const::_lambda(auto:1_const&)_4_>
            ((this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_a7a8096a)&avg_w);
  std::
  for_each<__gnu_cxx::__normal_iterator<tf::TFProfObserver::WorkerSummary_const*,std::vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>>,tf::TFProfObserver::Summary::dump_wsum(std::ostream&)const::_lambda(auto:1_const&)_5_>
            ((this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_a84b54ea)&min_w);
  std::
  for_each<__gnu_cxx::__normal_iterator<tf::TFProfObserver::WorkerSummary_const*,std::vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>>,tf::TFProfObserver::Summary::dump_wsum(std::ostream&)const::_lambda(auto:1_const&)_6_>
            ((this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_a847d77c)&max_w);
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 10;
  poVar2 = std::operator<<(os,"-Worker-");
  *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = (long)((int)l_w + 2);
  poVar2 = std::operator<<(poVar2,"Level");
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 10;
  poVar2 = std::operator<<(poVar2,"Task");
  *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = (long)((int)c_w + 2);
  poVar2 = std::operator<<(poVar2,"Count");
  *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = (long)((int)d_w + 2);
  poVar2 = std::operator<<(poVar2,"Time (us)");
  *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = (long)((int)avg_w + 2);
  poVar2 = std::operator<<(poVar2,"Avg (us)");
  *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = (long)((int)min_w + 2);
  poVar2 = std::operator<<(poVar2,"Min (us)");
  *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = (long)((int)max_w + 2);
  poVar2 = std::operator<<(poVar2,"Max (us)");
  std::operator<<(poVar2,'\n');
  local_58 = (this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (pWVar6 = (this->wsum).
                super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
                ._M_impl.super__Vector_impl_data._M_start; pWVar6 != local_58; pWVar6 = pWVar6 + 1)
  {
    if (pWVar6->count != 0) {
      *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 10;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
           (long)((l_w << 0x20) + 0x200000000) >> 0x20;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      bVar1 = true;
      for (lVar5 = 0; lVar5 != 0x1c; lVar5 = lVar5 + 4) {
        if ((&(pWVar6->tsum)._M_elems[0].count)[lVar5] != 0) {
          lVar4 = (long)((int)l_w + 0x16);
          if (bVar1) {
            lVar4 = 10;
          }
          *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = lVar4;
          pcVar3 = to_string(*(TaskType *)((long)&TASK_TYPES + lVar5));
          poVar2 = std::operator<<(os,pcVar3);
          *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
               (long)((c_w << 0x20) + 0x200000000) >> 0x20;
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
               (long)((d_w << 0x20) + 0x200000000) >> 0x20;
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
               (long)((avg_w << 0x20) + 0x200000000) >> 0x20;
          std::__cxx11::to_string
                    (&local_50,
                     (float)(&(pWVar6->tsum)._M_elems[0].total_span)[lVar5] /
                     (float)(&(pWVar6->tsum)._M_elems[0].count)[lVar5]);
          poVar2 = std::operator<<(poVar2,(string *)&local_50);
          *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
               (long)((min_w << 0x20) + 0x200000000) >> 0x20;
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
               (long)((max_w << 0x20) + 0x200000000) >> 0x20;
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::operator<<(poVar2,'\n');
          std::__cxx11::string::~string((string *)&local_50);
          bVar1 = false;
        }
      }
      *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (long)((int)l_w + (int)c_w + 0x18);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
           (long)((d_w << 0x20) + 0x200000000) >> 0x20;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
           (long)((avg_w << 0x20) + 0x200000000) >> 0x20;
      std::__cxx11::to_string(&local_50,(float)pWVar6->total_span / (float)pWVar6->count);
      poVar2 = std::operator<<(poVar2,(string *)&local_50);
      *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
           (long)((min_w << 0x20) + 0x200000000) >> 0x20;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
           (long)((max_w << 0x20) + 0x200000000) >> 0x20;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,'\n');
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

inline void TFProfObserver::Summary::dump_wsum(std::ostream& os) const {
  
  // task summary
  size_t w_w{10}, t_w{10}, l_w{5}, c_w{5}, d_w{9}, avg_w{8}, min_w{8}, max_w{8};

  std::for_each(wsum.begin(), wsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    l_w = (std::max)(l_w, std::to_string(i.level).size());
  });
  
  std::for_each(wsum.begin(), wsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    c_w = (std::max)(c_w, std::to_string(i.count).size());
  });
  
  std::for_each(wsum.begin(), wsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    d_w = (std::max)(d_w, std::to_string(i.total_span).size());
  });
  
  std::for_each(wsum.begin(), wsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    avg_w = (std::max)(avg_w, std::to_string(i.avg_span()).size());
  });
  
  std::for_each(wsum.begin(), wsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    min_w = (std::max)(min_w, std::to_string(i.min_span).size());
  });
  
  std::for_each(wsum.begin(), wsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    max_w = (std::max)(max_w, std::to_string(i.max_span).size());
  });
  
  os << std::setw(w_w) << "-Worker-" 
     << std::setw(l_w+2) << "Level"
     << std::setw(t_w) << "Task"
     << std::setw(c_w+2) << "Count"
     << std::setw(d_w+2) << "Time (us)"
     << std::setw(avg_w+2) << "Avg (us)"
     << std::setw(min_w+2) << "Min (us)"
     << std::setw(max_w+2) << "Max (us)"
     << '\n';

  for(const auto& ws : wsum) {

    if(ws.count == 0) {
      continue;
    }

    os << std::setw(w_w) << ws.id
       << std::setw(l_w+2) << ws.level;
    
    bool first = true;
    for(size_t i=0; i<TASK_TYPES.size(); i++) {

      if(ws.tsum[i].count == 0) {
        continue;
      }

      os << (first ? std::setw(t_w) : std::setw(w_w + l_w + 2 + t_w));
      first = false;

      os << to_string(TASK_TYPES[i])
         << std::setw(c_w+2) << ws.tsum[i].count
         << std::setw(d_w+2) << ws.tsum[i].total_span
         << std::setw(avg_w+2) << std::to_string(ws.tsum[i].avg_span())
         << std::setw(min_w+2) << ws.tsum[i].min_span
         << std::setw(max_w+2) << ws.tsum[i].max_span
         << '\n';
    }

    // per-worker summary
    os << std::setw(w_w + l_w + t_w + c_w + 4) << ws.count
       << std::setw(d_w+2) << ws.total_span
       << std::setw(avg_w+2) << std::to_string(ws.avg_span())
       << std::setw(min_w+2) << ws.min_span
       << std::setw(max_w+2) << ws.max_span
       << '\n';
    
    //for(size_t j=0; j<w_w+l_w+t_w+4; j++) os << ' ';
    //for(size_t j=0; j<c_w+d_w+avg_w+min_w+max_w+8; j++) os << '-';
    //os <<'\n';
  }
}